

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_&>
                  *this,vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                        *container,MatchResultListener *listener)

{
  bool bVar1;
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  MatchMatrix local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UnorderedElementsAreMatcherImpl<std::vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>const&>
  ::
  AnalyzeElements<__gnu_cxx::__normal_iterator<std::shared_ptr<bssl::ParsedCertificate_const>const*,std::vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>>>
            (&local_50,
             (UnorderedElementsAreMatcherImpl<std::vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>const&>
              *)this,(container->
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
             (container->
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,&local_28,listener);
  bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,&local_28,&local_50,listener);
  if (bVar1) {
    bVar1 = UnorderedElementsAreMatcherImplBase::FindPairing
                      (&this->super_UnorderedElementsAreMatcherImplBase,&local_50,listener);
  }
  else {
    bVar1 = false;
  }
  if (local_50.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  return bVar1;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }